

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compat_zip.c
# Opt level: O0

void compat_zip_6_verify(archive *a)

{
  archive_entry *in_RDI;
  wchar_t unaff_retaddr;
  char *in_stack_00000008;
  void *in_stack_00000010;
  archive_entry *ae;
  wchar_t in_stack_00000028;
  archive_entry **in_stack_ffffffffffffffd8;
  archive_entry **ppaVar1;
  archive_entry *entry;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar2;
  uint in_stack_ffffffffffffffe4;
  char *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  wchar_t in_stack_fffffffffffffff4;
  archive_entry *v1;
  
  archive_read_next_header
            ((archive *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffd8);
  entry = in_RDI;
  assertion_equal_int((char *)in_RDI,in_stack_fffffffffffffff4,(longlong)in_stack_ffffffffffffffe8,
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                      (longlong)in_RDI,(char *)0x149477,in_stack_00000010);
  archive_entry_pathname(in_RDI);
  uVar2 = 0;
  assertion_equal_string
            (in_stack_00000008,unaff_retaddr,(char *)entry,
             (char *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
             in_stack_ffffffffffffffe8,(char *)((ulong)in_stack_ffffffffffffffe4 << 0x20),a,
             in_stack_00000028);
  archive_entry_filetype
            ((archive_entry *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  assertion_equal_int((char *)entry,in_stack_fffffffffffffff4,(longlong)in_stack_ffffffffffffffe8,
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar2),0,(char *)0x1494fb,
                      in_stack_00000010);
  archive_entry_size((archive_entry *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0))
  ;
  ppaVar1 = (archive_entry **)0x0;
  assertion_equal_int((char *)entry,in_stack_fffffffffffffff4,(longlong)in_stack_ffffffffffffffe8,
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar2),0,(char *)0x149533,
                      in_stack_00000010);
  archive_read_next_header((archive *)CONCAT44(in_stack_ffffffffffffffe4,uVar2),ppaVar1);
  v1 = entry;
  assertion_equal_int((char *)entry,in_stack_fffffffffffffff4,(longlong)in_stack_ffffffffffffffe8,
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar2),(longlong)entry,
                      (char *)0x149571,in_stack_00000010);
  archive_entry_pathname(entry);
  uVar2 = 0;
  assertion_equal_string
            (in_stack_00000008,unaff_retaddr,(char *)v1,
             (char *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
             in_stack_ffffffffffffffe8,(char *)((ulong)in_stack_ffffffffffffffe4 << 0x20),a,
             in_stack_00000028);
  archive_entry_filetype
            ((archive_entry *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  assertion_equal_int((char *)v1,in_stack_fffffffffffffff4,(longlong)in_stack_ffffffffffffffe8,
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar2),0,(char *)0x1495f5,
                      in_stack_00000010);
  archive_entry_size((archive_entry *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0))
  ;
  ppaVar1 = (archive_entry **)0x0;
  assertion_equal_int((char *)v1,in_stack_fffffffffffffff4,(longlong)in_stack_ffffffffffffffe8,
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar2),0,(char *)0x149630,
                      in_stack_00000010);
  archive_read_next_header((archive *)CONCAT44(in_stack_ffffffffffffffe4,uVar2),ppaVar1);
  assertion_equal_int((char *)v1,in_stack_fffffffffffffff4,(longlong)in_stack_ffffffffffffffe8,
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar2),(longlong)v1,
                      (char *)0x14966f,in_stack_00000010);
  return;
}

Assistant:

static void
compat_zip_6_verify(struct archive *a)
{
	struct archive_entry *ae;

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("New Folder/New Folder/", archive_entry_pathname(ae));
	assertEqualInt(AE_IFDIR, archive_entry_filetype(ae));
	/* Zip timestamps are local time, so vary by time zone. */
	/* TODO: A more complex assert would work here; we could
	   verify that it's within +/- 24 hours of a particular value. */
	/* assertEqualInt(1327314468, archive_entry_mtime(ae)); */
	assertEqualInt(0, archive_entry_size(ae));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("New Folder/New Folder/New Text Document.txt", archive_entry_pathname(ae));
	assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
	/* Zip timestamps are local time, so vary by time zone. */
	/* assertEqualInt(1327314476, archive_entry_mtime(ae)); */
	assertEqualInt(11, archive_entry_size(ae));
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));
}